

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_routing_linux.c
# Opt level: O1

int os_routing_linux_set(os_route *route,_Bool set,_Bool del_similar)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  int iVar4;
  uint32_t uVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  undefined7 in_register_00000031;
  uint8_t uVar9;
  ulong uVar10;
  os_route os_rt;
  uint8_t buffer [1024];
  os_route_str rbuf;
  
  memset(buffer,0,0x400);
  memcpy(&os_rt,route,0xb0);
  buffer[0] = '\x1c';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  if ((int)CONCAT71(in_register_00000031,set) == 0) {
    buffer[4] = '\x19';
    buffer[5] = '\0';
    buffer[6] = '\x01';
    buffer[7] = '\0';
    os_rt.p._84_2_ = os_rt.p._84_2_ & 0xff;
    os_rt.p.src_ip._addr[0] = '\0';
    os_rt.p.src_ip._addr[1] = '\0';
    os_rt.p.src_ip._addr[2] = '\0';
    os_rt.p.src_ip._addr[3] = '\0';
    os_rt.p.src_ip._addr[4] = '\0';
    os_rt.p.src_ip._addr[5] = '\0';
    os_rt.p.src_ip._addr[6] = '\0';
    os_rt.p.src_ip._addr[7] = '\0';
    os_rt.p.src_ip._addr[8] = '\0';
    os_rt.p.src_ip._addr[9] = '\0';
    os_rt.p.src_ip._addr[10] = '\0';
    os_rt.p.src_ip._addr[0xb] = '\0';
    os_rt.p.src_ip._addr[0xc] = '\0';
    os_rt.p.src_ip._addr[0xd] = '\0';
    os_rt.p.src_ip._addr[0xe] = '\0';
    os_rt.p.src_ip._addr[0xf] = '\0';
    os_rt.p.src_ip._type = '\0';
    os_rt.p.src_ip._prefix_len = '\0';
    if (del_similar) {
      os_rt.p.if_index = 0;
      uVar9 = 0xff;
      goto LAB_00116f8f;
    }
  }
  else {
    buffer[4] = '\x18';
    buffer[5] = '\0';
    buffer[6] = '\x01';
    buffer[7] = '\x05';
  }
  uVar9 = '\0';
LAB_00116f8f:
  if ((os_rt.p.gw._type == '\0') && (os_rt.p.key.dst._type == '\x02')) {
    uVar1 = os_rt.p.key.dst._prefix_len;
    uVar2 = netaddr_get_af_maxprefix();
    if (uVar1 == uVar2) {
      os_rt.p.gw._type = os_rt.p.key.dst._type;
      os_rt.p.gw._prefix_len = os_rt.p.key.dst._prefix_len;
      os_rt.p.gw._addr[0] = os_rt.p.key.dst._addr[0];
      os_rt.p.gw._addr[1] = os_rt.p.key.dst._addr[1];
      os_rt.p.gw._addr[2] = os_rt.p.key.dst._addr[2];
      os_rt.p.gw._addr[3] = os_rt.p.key.dst._addr[3];
      os_rt.p.gw._addr[4] = os_rt.p.key.dst._addr[4];
      os_rt.p.gw._addr[5] = os_rt.p.key.dst._addr[5];
      os_rt.p.gw._addr[6] = os_rt.p.key.dst._addr[6];
      os_rt.p.gw._addr[7] = os_rt.p.key.dst._addr[7];
      os_rt.p.gw._addr[8] = os_rt.p.key.dst._addr[8];
      os_rt.p.gw._addr[9] = os_rt.p.key.dst._addr[9];
      os_rt.p.gw._addr[10] = os_rt.p.key.dst._addr[10];
      os_rt.p.gw._addr[0xb] = os_rt.p.key.dst._addr[0xb];
      os_rt.p.gw._addr[0xc] = os_rt.p.key.dst._addr[0xc];
      os_rt.p.gw._addr[0xd] = os_rt.p.key.dst._addr[0xd];
      os_rt.p.gw._addr[0xe] = os_rt.p.key.dst._addr[0xe];
      os_rt.p.gw._addr[0xf] = os_rt.p.key.dst._addr[0xf];
    }
  }
  uVar10 = (ulong)_oonf_os_routing_subsystem.logging;
  if (((&log_global_mask)[uVar10] & 1) != 0) {
    pcVar8 = "timer_fire";
    if (set) {
      pcVar8 = "\t%%%s%%\n";
    }
    pcVar6 = os_routing_generic_rt_to_string(&rbuf,&os_rt.p);
    oonf_log(1,uVar10,"src/base/os_linux/os_routing_linux.c",0xfc,0,0,"%sset route: %s",pcVar8 + 8,
             pcVar6);
  }
  if (os_rt.p.key.dst._type != '\0') {
    os_rt.p.family = os_rt.p.key.dst._type;
  }
  if (os_rt.p.gw._type != '\0') {
    if (os_rt.p.family != '\0' && os_rt.p.family != os_rt.p.gw._type) {
      return -1;
    }
    os_rt.p.family = os_rt.p.gw._type;
  }
  if (os_rt.p.src_ip._type != '\0') {
    if (os_rt.p.family != '\0' && os_rt.p.family != os_rt.p.src_ip._type) {
      return -1;
    }
    os_rt.p.family = os_rt.p.src_ip._type;
  }
  if (os_rt.p.family == '\0') {
    os_rt.p.family = '\x02';
  }
  buffer[0x10] = os_rt.p.family;
  buffer[0x14] = os_rt.p.table;
  buffer[0x15] = os_rt.p.protocol;
  buffer[0x17] = '\x01';
  lVar7 = 0;
  do {
    if (_type_translation[lVar7].oonf == os_rt.p.type) {
      buffer[0x17] = _type_translation[lVar7].os_linux;
      break;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 9);
  buffer[0x16] = uVar9;
  if (os_rt.p.src_ip._type != '\0') {
    bVar3 = netaddr_get_af_maxprefix();
    iVar4 = os_system_linux_netlink_addreq
                      (&_rtnetlink_socket,(nlmsghdr *)buffer,7,&os_rt.p.src_ip,(uint)(bVar3 >> 3));
    if (iVar4 != 0) {
      return -1;
    }
  }
  if (os_rt.p.gw._type != '\0') {
    buffer[0x18] = buffer[0x18] | 4;
    bVar3 = netaddr_get_af_maxprefix();
    iVar4 = os_system_linux_netlink_addreq
                      (&_rtnetlink_socket,(nlmsghdr *)buffer,5,&os_rt.p.gw,(uint)(bVar3 >> 3));
    if (iVar4 != 0) {
      return -1;
    }
  }
  if (os_rt.p.key.dst._type != '\0') {
    buffer[0x11] = os_rt.p.key.dst._prefix_len;
    bVar3 = netaddr_get_af_maxprefix();
    iVar4 = os_system_linux_netlink_addreq
                      (&_rtnetlink_socket,(nlmsghdr *)buffer,1,&os_rt.p.key,(uint)(bVar3 >> 3));
    if (iVar4 != 0) {
      return -1;
    }
  }
  if ((os_rt.p.key.src._type == '\n') && (os_rt.p.key.src._prefix_len != '\0')) {
    buffer[0x12] = os_rt.p.key.src._prefix_len;
    bVar3 = netaddr_get_af_maxprefix();
    iVar4 = os_system_linux_netlink_addreq
                      (&_rtnetlink_socket,(nlmsghdr *)buffer,2,&os_rt.p.key.src,(uint)(bVar3 >> 3));
    if (iVar4 != 0) {
      return -1;
    }
  }
  if ((os_rt.p.metric != -1) &&
     (iVar4 = os_system_linux_netlink_addreq
                        (&_rtnetlink_socket,(nlmsghdr *)buffer,6,&os_rt.p.metric,4), iVar4 != 0)) {
    return -1;
  }
  if ((os_rt.p.if_index != 0) &&
     (iVar4 = os_system_linux_netlink_addreq
                        (&_rtnetlink_socket,(nlmsghdr *)buffer,4,&os_rt.p.if_index,4), iVar4 != 0))
  {
    return -1;
  }
  uVar5 = os_system_linux_netlink_send(&_rtnetlink_socket,(nlmsghdr *)buffer);
  if (route->cb_finished != (_func_void_os_route_ptr_int *)0x0) {
    (route->_internal).nl_seq = uVar5;
    (route->_internal)._node.key = &(route->_internal).nl_seq;
    if ((((route->_internal)._node.list.next != (list_entity *)0x0) &&
        ((route->_internal)._node.list.prev != (list_entity *)0x0)) &&
       (uVar10 = (ulong)_oonf_os_routing_subsystem.logging, ((&log_global_mask)[uVar10] & 8) != 0))
    {
      pcVar8 = os_routing_generic_rt_to_string(&rbuf,&os_rt.p);
      oonf_log(8,uVar10,"src/base/os_linux/os_routing_linux.c",0x10b,0,0,
               "route %s is already in feedback list!",pcVar8);
      abort();
    }
    avl_insert(&_rtnetlink_feedback,&route->_internal);
  }
  return 0;
}

Assistant:

int
os_routing_linux_set(struct os_route *route, bool set, bool del_similar) {
  uint8_t buffer[UIO_MAXIOV];
  struct nlmsghdr *msg;
  unsigned char scope;
  struct os_route os_rt;
  int seq;
  struct os_route_str rbuf;

  memset(buffer, 0, sizeof(buffer));

  /* copy route settings */
  memcpy(&os_rt, route, sizeof(os_rt));

  /* get pointers for netlink message */
  msg = (void *)&buffer[0];

  msg->nlmsg_flags = NLM_F_REQUEST;

  /* set length of netlink message with rtmsg payload */
  msg->nlmsg_len = NLMSG_LENGTH(sizeof(struct rtmsg));

  /* normally all routing operations are UNIVERSE scope */
  scope = RT_SCOPE_UNIVERSE;

  if (set) {
    msg->nlmsg_flags |= NLM_F_CREATE | NLM_F_REPLACE;
    msg->nlmsg_type = RTM_NEWROUTE;
  }
  else {
    msg->nlmsg_type = RTM_DELROUTE;

    os_rt.p.protocol = 0;
    netaddr_invalidate(&os_rt.p.src_ip);

    if (del_similar) {
      /* no interface necessary */
      os_rt.p.if_index = 0;

      /* as wildcard for fuzzy deletion */
      scope = RT_SCOPE_NOWHERE;
    }
  }

  if (netaddr_is_unspec(&os_rt.p.gw) && netaddr_get_address_family(&os_rt.p.key.dst) == AF_INET &&
      netaddr_get_prefix_length(&os_rt.p.key.dst) == netaddr_get_maxprefix(&os_rt.p.key.dst)) {
    /* use destination as gateway, to 'force' linux kernel to do proper source address selection */
    memcpy(&os_rt.p.gw, &os_rt.p.key.dst, sizeof(os_rt.p.gw));
  }

  OONF_DEBUG(LOG_OS_ROUTING, "%sset route: %s", set ? "" : "re", os_routing_to_string(&rbuf, &os_rt.p));

  if (_routing_set(msg, &os_rt, scope)) {
    return -1;
  }

  /* cannot fail */
  seq = os_system_linux_netlink_send(&_rtnetlink_socket, msg);

  if (route->cb_finished) {
    route->_internal.nl_seq = seq;
    route->_internal._node.key = &route->_internal.nl_seq;

    OONF_ASSERT(!avl_is_node_added(&route->_internal._node),
                LOG_OS_ROUTING, "route %s is already in feedback list!",
                os_routing_to_string(&rbuf, &os_rt.p));
    avl_insert(&_rtnetlink_feedback, &route->_internal._node);
  }
  return 0;
}